

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_CALLBACK::OAssign(_Type_CALLBACK *this,Variable *obj1,Variable *obj2)

{
  Callback *c;
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Variable VStack_38;
  
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
  pOVar2 = Variable::operator->(in_RCX);
  if (bVar1) {
    pTVar3 = Object::GetType(pOVar2);
    pOVar2 = Variable::operator*(obj2);
    (*pTVar3->_vptr_Type[1])(pTVar3,pOVar2);
    pOVar2 = Variable::operator->(obj2);
    pTVar3 = Object::GetType(pOVar2);
    (*pTVar3->_vptr_Type[3])(&VStack_38,pTVar3,obj2);
    Variable::~Variable(&VStack_38);
  }
  else {
    c = (Callback *)pOVar2->data;
    pOVar2 = Variable::operator->(obj2);
    Callback::operator=((Callback *)pOVar2->data,c);
  }
  Variable::Variable((Variable *)this,obj2);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CALLBACK::OAssign(Variable &obj1, const Variable &obj2) const {
    if (obj2->GetType() != *this) {
        obj2->GetType().AssignObject(*obj1);
        obj1->GetType().OAssign(obj1, obj2);
    }
    else {
        obj1->GetData<Callback>() = obj2->GetData<Callback>();
    }
    return Variable(obj1);
}